

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

llm_graph_cb * __thiscall llama_context::graph_get_cb(llama_context *this)

{
  llm_graph_cb *in_RDI;
  
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  (in_RDI->super__Function_base)._M_manager = (_Manager_type)0x0;
  in_RDI->_M_invoker = (_Invoker_type)0x0;
  *(llama_context **)&(in_RDI->super__Function_base)._M_functor = this;
  in_RDI->_M_invoker =
       std::
       _Function_handler<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp:1667:12)>
       ::_M_invoke;
  (in_RDI->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp:1667:12)>
       ::_M_manager;
  return in_RDI;
}

Assistant:

llm_graph_cb llama_context::graph_get_cb() const {
    return [&](const llama_ubatch & ubatch, ggml_tensor * cur, const char * name, int il) {
        if (il >= 0) {
            ggml_format_name(cur, "%s-%d", name, il);
        } else {
            ggml_set_name(cur, name);
        }

        if (!cparams.offload_kqv) {
            if (strcmp(name, "kqv_merged_cont") == 0) {
                // all nodes between the KV store and the attention output are run on the CPU
                ggml_backend_sched_set_tensor_backend(sched.get(), cur, backend_cpu);
            }
        }

        // norm may be automatically assigned to the backend of the previous layer, increasing data transfer between backends
        // FIXME: fix in ggml_backend_sched
        const bool full_offload = model.params.n_gpu_layers > (int) model.hparams.n_layer;
        if (ubatch.n_tokens < 32 || full_offload) {
            if (il != -1 && strcmp(name, "norm") == 0) {
                const auto & dev_layer = model.dev_layer(il);
                for (const auto & backend : backends) {
                    if (ggml_backend_get_device(backend.get()) == dev_layer) {
                        if (ggml_backend_supports_op(backend.get(), cur)) {
                            ggml_backend_sched_set_tensor_backend(sched.get(), cur, backend.get());
                        }
                    }
                }
            }
        }
    };
}